

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

int background_thread_create_signals_masked
              (pthread_t *thread,pthread_attr_t *attr,_func_void_ptr_void_ptr *start_routine,
              void *arg)

{
  uint uVar1;
  uint uVar2;
  sigset_t oldset;
  sigset_t set;
  __sigset_t _Stack_118;
  sigset_t local_98;
  
  sigfillset(&local_98);
  uVar1 = pthread_sigmask(2,&local_98,&_Stack_118);
  if (uVar1 == 0) {
    uVar1 = (*pthread_create_fptr)(thread,(pthread_attr_t *)0x0,background_thread_entry,attr);
    uVar2 = pthread_sigmask(2,&_Stack_118,(__sigset_t *)0x0);
    if (uVar2 != 0) {
      malloc_printf("<jemalloc>: background thread creation failed (%d), and signal mask restoration failed (%d)\n"
                    ,(ulong)uVar1,(ulong)uVar2);
      if (opt_abort == true) {
        abort();
      }
    }
  }
  return uVar1;
}

Assistant:

static int
background_thread_create_signals_masked(pthread_t *thread,
    const pthread_attr_t *attr, void *(*start_routine)(void *), void *arg) {
	/*
	 * Mask signals during thread creation so that the thread inherits
	 * an empty signal set.
	 */
	sigset_t set;
	sigfillset(&set);
	sigset_t oldset;
	int mask_err = pthread_sigmask(SIG_SETMASK, &set, &oldset);
	if (mask_err != 0) {
		return mask_err;
	}
	int create_err = pthread_create_wrapper(thread, attr, start_routine,
	    arg);
	/*
	 * Restore the signal mask.  Failure to restore the signal mask here
	 * changes program behavior.
	 */
	int restore_err = pthread_sigmask(SIG_SETMASK, &oldset, NULL);
	if (restore_err != 0) {
		malloc_printf("<jemalloc>: background thread creation "
		    "failed (%d), and signal mask restoration failed "
		    "(%d)\n", create_err, restore_err);
		if (opt_abort) {
			abort();
		}
	}
	return create_err;
}